

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_coin.cpp
# Opt level: O0

string * __thiscall
cfd::core::BlockHash::GetHex_abi_cxx11_(string *__return_storage_ptr__,BlockHash *this)

{
  pointer *__return_storage_ptr___00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  allocator_type *in_stack_ffffffffffffff98;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffffa0;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffffa8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> reverse_buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  BlockHash *this_local;
  
  __return_storage_ptr___00 =
       &reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     __return_storage_ptr___00,&this->data_);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffa8;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::crbegin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr___00);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::crend
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr___00);
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x47c829);
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x47c84c);
  StringUtil::ByteToString_abi_cxx11_
            ((StringUtil *)__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffb0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  return __return_storage_ptr__;
}

Assistant:

const std::string BlockHash::GetHex() const {
  const std::vector<uint8_t>& data = data_.GetBytes();
  std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
  return StringUtil::ByteToString(reverse_buffer);
}